

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

void traverse_hplane_csc<PredictionData<double,unsigned_long>,unsigned_long>
               (WorkerForPredictCSC *workspace,
               vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes,ExtIsoForest *model_outputs,
               PredictionData<double,_unsigned_long> *prediction_data,unsigned_long *tree_num,
               double *per_tree_depths,size_t curr_tree,bool has_range_penalty)

{
  int iVar1;
  CategSplit cat_split_type;
  pointer pdVar2;
  unsigned_long uVar3;
  long lVar4;
  size_t row;
  ulong uVar5;
  size_t sVar6;
  pointer pIVar7;
  size_t sVar8;
  pointer puVar9;
  pointer pIVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  pointer puVar16;
  double dVar17;
  double unused;
  double *local_70;
  int local_68;
  long local_48;
  double local_38;
  
  pIVar7 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pIVar7[curr_tree].hplane_left == 0) {
    uVar5 = workspace->st;
    uVar14 = workspace->end;
    if (uVar5 <= uVar14) {
      puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar2 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar15 = uVar5;
      do {
        uVar3 = puVar9[uVar15];
        pdVar2[uVar3] = pIVar7[curr_tree].score + pdVar2[uVar3];
        uVar15 = uVar15 + 1;
      } while (uVar15 <= uVar14);
      if ((tree_num != (unsigned_long *)0x0) && (uVar5 <= uVar14)) {
        puVar9 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar15 = uVar5;
        do {
          tree_num[puVar9[uVar15]] = curr_tree;
          uVar15 = uVar15 + 1;
        } while (uVar15 <= uVar14);
      }
    }
    if ((per_tree_depths != (double *)0x0) && (uVar5 <= uVar14)) {
      puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar17 = pIVar7[curr_tree].score;
      do {
        per_tree_depths[puVar9[uVar5]] = dVar17;
        uVar5 = uVar5 + 1;
      } while (uVar5 <= uVar14);
    }
  }
  else {
    puVar16 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar8 = workspace->st;
    puVar9 = puVar16 + sVar8;
    sVar6 = workspace->end;
    puVar16 = puVar16 + sVar6 + 1;
    if (puVar9 != puVar16) {
      uVar5 = (long)puVar16 - (long)puVar9 >> 3;
      lVar12 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar9,puVar16,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar9);
      sVar8 = workspace->st;
      sVar6 = workspace->end;
    }
    pdVar2 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar2 != pdVar2 + (sVar6 - sVar8) + 1) {
      memset(pdVar2,0,(sVar6 - sVar8) * 8 + 8);
    }
    pIVar10 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pIVar7 = pIVar10 + curr_tree;
    puVar9 = *(pointer *)
              &pIVar10[curr_tree].col_num.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
    puVar16 = *(pointer *)
               ((long)&pIVar10[curr_tree].col_num.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               );
    if (prediction_data->categ_data == (int *)0x0) {
      if (puVar16 != puVar9) {
        uVar5 = 0;
        do {
          pdVar11 = &local_38;
          if (model_outputs->missing_action != Fail) {
            pdVar11 = (double *)
                      (*(long *)&(pIVar7->fill_val).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + uVar5 * 8);
          }
          add_linear_comb<double,unsigned_long>
                    ((workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,workspace->st,workspace->end,puVar9[uVar5],
                     (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start,prediction_data->Xc,
                     prediction_data->Xc_ind,prediction_data->Xc_indptr,
                     (double *)
                     (uVar5 * 8 +
                     *(long *)&(pIVar7->coef).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data),0.0,
                     *(double *)
                      (*(long *)&(pIVar7->mean).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data + uVar5 * 8),pdVar11,
                     model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
          uVar5 = uVar5 + 1;
          pIVar10 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pIVar7 = pIVar10 + curr_tree;
          puVar9 = *(pointer *)
                    &pIVar10[curr_tree].col_num.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
        } while (uVar5 < (ulong)((long)*(pointer *)
                                        ((long)&pIVar10[curr_tree].col_num.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl + 8) - (long)puVar9 >> 3));
      }
    }
    else if (puVar16 != puVar9) {
      lVar13 = 0;
      uVar5 = 0;
      lVar12 = 0;
      local_48 = 0;
      do {
        iVar1 = *(int *)(*(long *)&(pIVar7->col_type).
                                   super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
                                   super__Vector_impl_data + uVar5 * 4);
        if (iVar1 == 0x20) {
          cat_split_type = model_outputs->cat_split_type;
          if (cat_split_type == SingleCateg) {
            dVar17 = *(double *)
                      (*(long *)&(pIVar7->fill_new).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + lVar12 * 8);
            iVar1 = *(int *)(*(long *)&(pIVar7->chosen_cat).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + lVar12 * 4);
LAB_00247545:
            local_68 = 0;
            local_70 = (double *)0x0;
          }
          else {
            iVar1 = 0;
            dVar17 = 0.0;
            if (cat_split_type != SubSet) goto LAB_00247545;
            lVar4 = *(long *)&(pIVar7->cat_coef).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            local_70 = *(double **)(lVar4 + lVar12 * 0x18);
            local_68 = (int)((ulong)(*(long *)(lVar4 + 8 + lVar12 * 0x18) - (long)local_70) >> 3);
          }
          add_linear_comb<double>
                    ((workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,workspace->st,workspace->end,
                     (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     prediction_data->categ_data + prediction_data->nrows * puVar9[uVar5],local_68,
                     local_70,dVar17,iVar1,
                     (double *)
                     (*(long *)&(pIVar7->fill_val).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + lVar13),
                     (double *)
                     (lVar12 * 8 +
                     *(long *)&(pIVar7->fill_new).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data),(size_t *)0x0,(size_t *)0x0,
                     model_outputs->new_cat_action,model_outputs->missing_action,cat_split_type,
                     false);
          lVar12 = lVar12 + 1;
        }
        else if (iVar1 == 0x1f) {
          pdVar11 = &local_38;
          if (model_outputs->missing_action != Fail) {
            pdVar11 = (double *)
                      (*(long *)&(pIVar7->fill_val).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + lVar13);
          }
          add_linear_comb<double,unsigned_long>
                    ((workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,workspace->st,workspace->end,puVar9[uVar5],
                     (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start,prediction_data->Xc,
                     prediction_data->Xc_ind,prediction_data->Xc_indptr,
                     (double *)
                     (local_48 * 8 +
                     *(long *)&(pIVar7->coef).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data),0.0,
                     *(double *)
                      (*(long *)&(pIVar7->mean).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data + local_48 * 8),pdVar11,
                     model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
          local_48 = local_48 + 1;
        }
        uVar5 = uVar5 + 1;
        pIVar10 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pIVar7 = pIVar10 + curr_tree;
        puVar9 = *(pointer *)
                  &pIVar10[curr_tree].col_num.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
        lVar13 = lVar13 + 8;
      } while (uVar5 < (ulong)((long)*(pointer *)
                                      ((long)&pIVar10[curr_tree].col_num.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl + 8) - (long)puVar9 >> 3));
    }
    uVar5 = workspace->st;
    sVar8 = workspace->end;
    if (uVar5 <= sVar8 && has_range_penalty) {
      puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar11 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = uVar5;
      do {
        dVar17 = 1.0;
        if (pIVar10[curr_tree].range_low <= *pdVar11) {
          dVar17 = (double)(-(ulong)(pIVar10[curr_tree].range_high < *pdVar11) & 0x3ff0000000000000)
          ;
        }
        uVar3 = puVar9[uVar14];
        pdVar2[uVar3] = pdVar2[uVar3] - dVar17;
        uVar14 = uVar14 + 1;
        pdVar11 = pdVar11 + 1;
      } while (uVar14 <= sVar8);
    }
    if (uVar5 <= sVar8) {
      puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar11 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar17 = pIVar10[curr_tree].split_point;
      uVar14 = uVar5;
      do {
        if (*pdVar11 <= dVar17) {
          uVar3 = puVar9[uVar14];
          puVar9[uVar14] = puVar9[uVar5];
          puVar9[uVar5] = uVar3;
          uVar14 = uVar14 + 1;
        }
        uVar5 = uVar5 + 1;
        pdVar11 = pdVar11 + 1;
      } while (uVar5 <= sVar8);
      sVar8 = workspace->end;
      uVar5 = uVar14;
      if (workspace->st < uVar14) {
        workspace->end = uVar14 - 1;
        traverse_hplane_csc<PredictionData<double,unsigned_long>,unsigned_long>
                  (workspace,hplanes,model_outputs,prediction_data,tree_num,per_tree_depths,
                   pIVar10[curr_tree].hplane_left,has_range_penalty);
      }
    }
    if (uVar5 <= sVar8) {
      workspace->st = uVar5;
      workspace->end = sVar8;
      traverse_hplane_csc<PredictionData<double,unsigned_long>,unsigned_long>
                (workspace,hplanes,model_outputs,prediction_data,tree_num,per_tree_depths,
                 (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].hplane_right,has_range_penalty);
    }
  }
  return;
}

Assistant:

void traverse_hplane_csc(WorkerForPredictCSC      &workspace,
                         std::vector<IsoHPlane>   &hplanes,
                         ExtIsoForest             &model_outputs,
                         PredictionData           &prediction_data,
                         sparse_ix *restrict      tree_num,
                         double *restrict         per_tree_depths,
                         size_t                   curr_tree,
                         bool                     has_range_penalty)
{
    // if (hplanes[curr_tree].score >= 0)
    if (unlikely(hplanes[curr_tree].hplane_left == 0))
    {
        for (size_t row = workspace.st; row <= workspace.end; row++)
            workspace.depths[workspace.ix_arr[row]] += hplanes[curr_tree].score;
        if (unlikely(tree_num != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                tree_num[workspace.ix_arr[row]] = curr_tree;
        if (unlikely(per_tree_depths != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                per_tree_depths[workspace.ix_arr[row]] = hplanes[curr_tree].score;
        return;
    }

    std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
    std::fill(workspace.comb_val.begin(), workspace.comb_val.begin() + (workspace.end - workspace.st + 1), 0.);
    double unused;

    if (likely(prediction_data.categ_data == NULL))
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
            add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                            hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                            prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                            hplanes[curr_tree].coef[col], (double)0, hplanes[curr_tree].mean[col],
                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                            model_outputs.missing_action, NULL, NULL, false);
    }

    else
    {
        size_t ncols_numeric = 0;
        size_t ncols_categ = 0;
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
        {
            switch (hplanes[curr_tree].col_type[col])
            {
                case Numeric:
                {
                    add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                                    hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                                    prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                    hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                    (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                    model_outputs.missing_action, NULL, NULL, false);
                    ncols_numeric++;
                    break;
                }

                case Categorical:
                {
                    add_linear_comb<double>(
                                    workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                    prediction_data.categ_data + hplanes[curr_tree].col_num[col] * prediction_data.nrows,
                                    (model_outputs.cat_split_type == SubSet)? (int)hplanes[curr_tree].cat_coef[ncols_categ].size() : 0,
                                    (model_outputs.cat_split_type == SubSet)? hplanes[curr_tree].cat_coef[ncols_categ].data() : NULL,
                                    (model_outputs.cat_split_type == SingleCateg)? hplanes[curr_tree].fill_new[ncols_categ] : 0.,
                                    (model_outputs.cat_split_type == SingleCateg)? hplanes[curr_tree].chosen_cat[ncols_categ] : 0,
                                    hplanes[curr_tree].fill_val[col], hplanes[curr_tree].fill_new[ncols_categ], NULL, NULL,
                                    model_outputs.new_cat_action, model_outputs.missing_action, model_outputs.cat_split_type, false);
                    ncols_categ++;
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            }
        }
    }

    if (has_range_penalty)
    {
        for (size_t row = workspace.st; row <= workspace.end; row++)
            workspace.depths[workspace.ix_arr[row]]
                -=
            (workspace.comb_val[row - workspace.st] < hplanes[curr_tree].range_low) ||
            (workspace.comb_val[row - workspace.st] > hplanes[curr_tree].range_high);
    }

    /* divide data */
    size_t split_ix = divide_subset_split(workspace.ix_arr.data(), workspace.comb_val.data(),
                                          workspace.st, workspace.end, hplanes[curr_tree].split_point);

    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (split_ix > workspace.st)
    {
        workspace.end = split_ix - 1;
        traverse_hplane_csc(workspace,
                            hplanes,
                            model_outputs,
                            prediction_data,
                            tree_num,
                            per_tree_depths,
                            hplanes[curr_tree].hplane_left,
                            has_range_penalty);
    }

    if (split_ix <= orig_end)
    {
        workspace.st  = split_ix;
        workspace.end = orig_end;
        traverse_hplane_csc(workspace,
                            hplanes,
                            model_outputs,
                            prediction_data,
                            tree_num,
                            per_tree_depths,
                            hplanes[curr_tree].hplane_right,
                            has_range_penalty);
    }
}